

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O2

void __thiscall pstack::Exception::~Exception(Exception *this)

{
  ~Exception(this);
  operator_delete(this,0x1a0);
  return;
}

Assistant:

~Exception() noexcept = default;